

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pq_test.cpp
# Opt level: O0

void __thiscall
priorityQueueTest_ordered_data_Test::priorityQueueTest_ordered_data_Test
          (priorityQueueTest_ordered_data_Test *this)

{
  priorityQueueTest_ordered_data_Test *this_local;
  
  priorityQueueTest::priorityQueueTest(&this->super_priorityQueueTest);
  (this->super_priorityQueueTest).super_Test._vptr_Test =
       (_func_int **)&PTR__priorityQueueTest_ordered_data_Test_001ade48;
  return;
}

Assistant:

TEST_F(priorityQueueTest, ordered_data) {
    std::priority_queue<double> std_pq;
    Priority_queue pq;
    for (unsigned int i = 0; i != 100000; ++i) {
        std_pq.push((double) i);
        pq.push((double) i);
    }
    ASSERT_DOUBLE_EQ(std_pq.top(), pq.top());
    ASSERT_EQ(std_pq.size(), pq.size());
    while (!pq.empty()) {
        ASSERT_DOUBLE_EQ(std_pq.top(), pq.top());
        std_pq.pop();
        pq.pop();
    }
    ASSERT_EQ(pq.size(), 0);
    ASSERT_EQ(std_pq.size(), 0);
}